

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_uniform(CompilerGLSL *this,SPIRVariable *var)

{
  uint32_t uVar1;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  undefined1 local_a0 [40];
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  SPIRType *local_20;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  local_20 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
  if (((*(int *)&(local_20->super_IVariant).field_0xc == 0x10) && ((local_20->image).sampled == 2))
     && ((local_20->image).dim != DimSubpassData)) {
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1a4)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"GL_ARB_shader_image_load_store",&local_41);
      require_extension_internal(this,(string *)local_40);
      ::std::__cxx11::string::~string(local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
      local_a0[0x26] = 1;
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_78,"At least ESSL 3.10 required for shader image load store.",
                 (allocator *)(local_a0 + 0x27));
      CompilerError::CompilerError(this_00,(string *)local_78);
      local_a0[0x26] = 0;
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
  }
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  add_resource_name(this,uVar1);
  layout_for_variable_abi_cxx11_((CompilerGLSL *)local_a0,(SPIRVariable *)this);
  (*(this->super_Compiler)._vptr_Compiler[0x27])(local_c0,this,type);
  statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
             local_c0,(char (*) [2])0x5e9b70);
  ::std::__cxx11::string::~string((string *)local_c0);
  ::std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

void CompilerGLSL::emit_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	if (type.basetype == SPIRType::Image && type.image.sampled == 2 && type.image.dim != DimSubpassData)
	{
		if (!options.es && options.version < 420)
			require_extension_internal("GL_ARB_shader_image_load_store");
		else if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for shader image load store.");
	}

	add_resource_name(var.self);
	statement(layout_for_variable(var), variable_decl(var), ";");
}